

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void booke206_invalidate_ea_tlb(CPUPPCState_conflict2 *env,int tlbn,uint32_t ea)

{
  byte bVar1;
  uint uVar2;
  ppcmas_tlb_t *ppVar3;
  uint way;
  
  bVar1 = *(byte *)((long)env->spr + (long)tlbn * 8 + 0x1583);
  for (way = 0; bVar1 != way; way = way + 1) {
    ppVar3 = booke206_get_tlbm(env,tlbn,(ulong)ea,way);
    if (ppVar3 != (ppcmas_tlb_t *)0x0) {
      uVar2 = ppVar3->mas1;
      if (((uVar2 >> 0x1e & 1) == 0) &&
         ((ppVar3->mas2 & 0xfffffffffffff000) == (ulong)(-0x400 << ((byte)(uVar2 >> 7) & 0x1f) & ea)
         )) {
        ppVar3->mas1 = uVar2 & 0x3fffffff;
      }
    }
  }
  return;
}

Assistant:

static inline void booke206_invalidate_ea_tlb(CPUPPCState *env, int tlbn,
                                              uint32_t ea)
{
    int i;
    int ways = booke206_tlb_ways(env, tlbn);
    target_ulong mask;

    for (i = 0; i < ways; i++) {
        ppcmas_tlb_t *tlb = booke206_get_tlbm(env, tlbn, ea, i);
        if (!tlb) {
            continue;
        }
        mask = ~(booke206_tlb_to_page_size(env, tlb) - 1);
        if (((tlb->mas2 & MAS2_EPN_MASK) == (ea & mask)) &&
            !(tlb->mas1 & MAS1_IPROT)) {
            tlb->mas1 &= ~MAS1_VALID;
        }
    }
}